

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsql_sqlite.cpp
# Opt level: O0

QStringView * __thiscall
QSQLiteDriverPrivate::getTableInfo
          (QSQLiteDriverPrivate *this,QSqlQuery *query,QString *tableName,bool onlyPIndex)

{
  QStringView identifier;
  QStringView identifier_00;
  bool bVar1;
  byte bVar2;
  int iVar3;
  QSQLiteDriver *pQVar4;
  qsizetype qVar5;
  ulong uVar6;
  QString *in_RCX;
  QString *in_RDX;
  QSQLiteDriverPrivate *in_RSI;
  QStringView *in_RDI;
  byte in_R8B;
  long in_FS_OFFSET;
  byte bVar7;
  int end;
  bool isPk;
  qsizetype indexOfSeparator;
  QSQLiteDriver *q;
  QSqlIndex *ind;
  QString defVal;
  QString typeName;
  QStringView rightName;
  QStringView leftName;
  QString table;
  QString schema;
  QSqlField fld;
  undefined4 in_stack_fffffffffffffbe8;
  CaseSensitivity in_stack_fffffffffffffbec;
  uint5 in_stack_fffffffffffffbf0;
  undefined1 in_stack_fffffffffffffbf5;
  undefined1 in_stack_fffffffffffffbf6;
  undefined1 uVar8;
  undefined1 in_stack_fffffffffffffbf7;
  QString *in_stack_fffffffffffffbf8;
  QStringView *tpName;
  QChar in_stack_fffffffffffffc1e;
  QMetaType local_398;
  undefined1 local_390 [24];
  undefined1 local_378 [26];
  QChar local_35e;
  QChar local_35c;
  char16_t local_35a;
  undefined1 *local_358;
  undefined1 *local_350;
  undefined1 *local_348;
  undefined1 *local_328;
  undefined1 *local_320;
  undefined1 *local_318;
  undefined1 local_310 [24];
  undefined1 local_2f8 [30];
  undefined2 local_2da;
  QLatin1StringView local_2d8;
  QLatin1StringView local_2c8;
  undefined2 local_212;
  qsizetype local_1e0;
  storage_type *local_1d8;
  qsizetype local_1d0;
  storage_type *local_1c8;
  QStringView local_1b0;
  QStringView local_190;
  QChar local_17a;
  undefined1 *local_178;
  undefined1 *local_170;
  undefined1 *local_168;
  undefined1 *local_160;
  undefined1 *local_158;
  undefined1 *local_150;
  QVariant local_f0;
  QVariant local_d0;
  QVariant local_b0;
  QSqlField local_90 [40];
  QVariant local_68;
  QVariant local_48;
  QVariant local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  tpName = in_RDI;
  pQVar4 = q_func(in_RSI);
  local_160 = &DAT_aaaaaaaaaaaaaaaa;
  local_158 = &DAT_aaaaaaaaaaaaaaaa;
  local_150 = &DAT_aaaaaaaaaaaaaaaa;
  QString::QString((QString *)0x113a24);
  local_178 = &DAT_aaaaaaaaaaaaaaaa;
  local_170 = &DAT_aaaaaaaaaaaaaaaa;
  local_168 = &DAT_aaaaaaaaaaaaaaaa;
  (**(code **)(*(long *)pQVar4 + 0xa0))(&local_178,pQVar4,in_RCX,1);
  QChar::QChar<char16_t,_true>(&local_17a,L'.');
  qVar5 = QString::indexOf(in_stack_fffffffffffffbf8,in_stack_fffffffffffffc1e,
                           CONCAT17(in_stack_fffffffffffffbf7,
                                    CONCAT16(in_stack_fffffffffffffbf6,
                                             CONCAT15(in_stack_fffffffffffffbf5,
                                                      in_stack_fffffffffffffbf0))),
                           in_stack_fffffffffffffbec);
  if (-1 < qVar5) {
    local_190.m_data = (storage_type *)&DAT_aaaaaaaaaaaaaaaa;
    local_190.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    QStringView::QStringView<QString,_true>(in_RDI,in_stack_fffffffffffffbf8);
    local_190 = QStringView::first((QStringView *)
                                   CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8),
                                   0x113af7);
    local_1b0.m_data = (storage_type *)&DAT_aaaaaaaaaaaaaaaa;
    local_1b0.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    QStringView::QStringView<QString,_true>(in_RDI,in_stack_fffffffffffffbf8);
    local_1b0 = QStringView::sliced(in_RDI,(qsizetype)in_stack_fffffffffffffbf8);
    local_1d0 = local_190.m_size;
    local_1c8 = local_190.m_data;
    identifier.m_data = (storage_type *)tpName;
    identifier.m_size = (qsizetype)in_RDI;
    bVar1 = isIdentifierEscaped((QSQLiteDriverPrivate *)
                                CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8),
                                identifier);
    if (bVar1) {
      local_1e0 = local_1b0.m_size;
      local_1d8 = local_1b0.m_data;
      identifier_00.m_data = (storage_type *)tpName;
      identifier_00.m_size = (qsizetype)in_RDI;
      bVar1 = isIdentifierEscaped((QSQLiteDriverPrivate *)
                                  CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8),
                                  identifier_00);
      if (bVar1) {
        QStringView::toString
                  ((QStringView *)
                   CONCAT17(in_stack_fffffffffffffbf7,
                            CONCAT16(in_stack_fffffffffffffbf6,
                                     CONCAT15(in_stack_fffffffffffffbf5,in_stack_fffffffffffffbf0)))
                  );
        local_212 = 0x2e;
        ::operator+(in_stack_fffffffffffffbf8,
                    (char16_t *)
                    CONCAT17(in_stack_fffffffffffffbf7,
                             CONCAT16(in_stack_fffffffffffffbf6,
                                      CONCAT15(in_stack_fffffffffffffbf5,in_stack_fffffffffffffbf0))
                            ));
        QStringBuilder::operator_cast_to_QString
                  ((QStringBuilder<QString,_char16_t> *)
                   CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
        QString::operator=((QString *)
                           CONCAT17(in_stack_fffffffffffffbf7,
                                    CONCAT16(in_stack_fffffffffffffbf6,
                                             CONCAT15(in_stack_fffffffffffffbf5,
                                                      in_stack_fffffffffffffbf0))),
                           (QString *)CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8))
        ;
        QString::~QString((QString *)0x113c59);
        QStringBuilder<QString,_char16_t>::~QStringBuilder
                  ((QStringBuilder<QString,_char16_t> *)0x113c66);
        QString::~QString((QString *)0x113c73);
        QStringView::toString
                  ((QStringView *)
                   CONCAT17(in_stack_fffffffffffffbf7,
                            CONCAT16(in_stack_fffffffffffffbf6,
                                     CONCAT15(in_stack_fffffffffffffbf5,in_stack_fffffffffffffbf0)))
                  );
        QString::operator=((QString *)
                           CONCAT17(in_stack_fffffffffffffbf7,
                                    CONCAT16(in_stack_fffffffffffffbf6,
                                             CONCAT15(in_stack_fffffffffffffbf5,
                                                      in_stack_fffffffffffffbf0))),
                           (QString *)CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8))
        ;
        QString::~QString((QString *)0x113caa);
      }
    }
  }
  local_2c8 = Qt::Literals::StringLiterals::operator____L1
                        ((char *)in_RDX,
                         CONCAT17(in_stack_fffffffffffffbf7,
                                  CONCAT16(in_stack_fffffffffffffbf6,
                                           CONCAT15(in_stack_fffffffffffffbf5,
                                                    in_stack_fffffffffffffbf0))));
  ::operator+((QLatin1String *)
              CONCAT17(in_stack_fffffffffffffbf7,
                       CONCAT16(in_stack_fffffffffffffbf6,
                                CONCAT15(in_stack_fffffffffffffbf5,in_stack_fffffffffffffbf0))),
              (QString *)CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
  local_2d8 = Qt::Literals::StringLiterals::operator____L1
                        ((char *)in_RDX,
                         CONCAT17(in_stack_fffffffffffffbf7,
                                  CONCAT16(in_stack_fffffffffffffbf6,
                                           CONCAT15(in_stack_fffffffffffffbf5,
                                                    in_stack_fffffffffffffbf0))));
  ::operator+((QStringBuilder<QLatin1String,_QString_&> *)
              CONCAT17(in_stack_fffffffffffffbf7,
                       CONCAT16(in_stack_fffffffffffffbf6,
                                CONCAT15(in_stack_fffffffffffffbf5,in_stack_fffffffffffffbf0))),
              (QLatin1String *)CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
  ::operator+((QStringBuilder<QStringBuilder<QLatin1String,_QString_&>,_QLatin1String> *)
              CONCAT17(in_stack_fffffffffffffbf7,
                       CONCAT16(in_stack_fffffffffffffbf6,
                                CONCAT15(in_stack_fffffffffffffbf5,in_stack_fffffffffffffbf0))),
              (QString *)CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
  local_2da = 0x29;
  ::operator+((QStringBuilder<QStringBuilder<QStringBuilder<QLatin1String,_QString_&>,_QLatin1String>,_QString_&>
               *)CONCAT17(in_stack_fffffffffffffbf7,
                          CONCAT16(in_stack_fffffffffffffbf6,
                                   CONCAT15(in_stack_fffffffffffffbf5,in_stack_fffffffffffffbf0))),
              (char16_t *)CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
  QStringBuilder::operator_cast_to_QString
            ((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QLatin1String,_QString_&>,_QLatin1String>,_QString_&>,_char16_t>
              *)CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
  QSqlQuery::exec((QString *)in_RDX);
  QString::~QString((QString *)0x113daa);
  memset(in_RDI,0xaa,0x50);
  QString::QString((QString *)0x113dd0);
  QString::QString((QString *)0x113ddd);
  QSqlIndex::QSqlIndex((QSqlIndex *)in_RDI,(QString *)local_2f8,(QString *)local_310);
  QString::~QString((QString *)0x113e04);
  QString::~QString((QString *)0x113e11);
  while (uVar6 = QSqlQuery::next(), (uVar6 & 1) != 0) {
    QSqlQuery::value((int)&local_28);
    iVar3 = QVariant::toInt((bool *)&local_28);
    bVar7 = iVar3 != 0;
    QVariant::~QVariant(&local_28);
    bVar2 = bVar7 & 1;
    if (((in_R8B & 1) == 0) || (bVar2 != 0)) {
      local_328 = &DAT_aaaaaaaaaaaaaaaa;
      local_320 = &DAT_aaaaaaaaaaaaaaaa;
      local_318 = &DAT_aaaaaaaaaaaaaaaa;
      QSqlQuery::value((int)&local_48);
      QVariant::toString();
      QString::toLower((QString *)CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
      QString::~QString((QString *)0x113ef8);
      QVariant::~QVariant(&local_48);
      local_358 = &DAT_aaaaaaaaaaaaaaaa;
      local_350 = &DAT_aaaaaaaaaaaaaaaa;
      local_348 = &DAT_aaaaaaaaaaaaaaaa;
      QSqlQuery::value((int)&local_68);
      QVariant::toString();
      QVariant::~QVariant(&local_68);
      bVar1 = QString::isEmpty((QString *)0x113f78);
      uVar8 = false;
      if (!bVar1) {
        local_35a = (char16_t)
                    QString::at(in_RDX,CONCAT17(bVar7,(uint7)CONCAT15(in_stack_fffffffffffffbf5,
                                                                      in_stack_fffffffffffffbf0)));
        QChar::QChar<char16_t,_true>(&local_35c,L'\'');
        uVar8 = operator==((QChar *)CONCAT17(bVar7,CONCAT16(uVar8,CONCAT15(in_stack_fffffffffffffbf5
                                                                           ,
                                                  in_stack_fffffffffffffbf0))),
                           (QChar *)CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
      }
      if ((bool)uVar8 != false) {
        QChar::QChar<char16_t,_true>(&local_35e,L'\'');
        qVar5 = QString::lastIndexOf
                          ((QString *)
                           CONCAT17(bVar7,CONCAT16(uVar8,CONCAT15(in_stack_fffffffffffffbf5,
                                                                  in_stack_fffffffffffffbf0))),
                           (QChar)(char16_t)((ulong)in_RDX >> 0x30),in_stack_fffffffffffffbec);
        if (0 < (int)qVar5) {
          QString::mid((longlong)local_378,(longlong)&local_358);
          QString::operator=((QString *)
                             CONCAT17(bVar7,CONCAT16(uVar8,CONCAT15(in_stack_fffffffffffffbf5,
                                                                    in_stack_fffffffffffffbf0))),
                             (QString *)
                             CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
          QString::~QString((QString *)0x114050);
        }
      }
      memset(local_90,0xaa,0x28);
      QSqlQuery::value((int)&local_b0);
      QVariant::toString();
      iVar3 = qGetColumnType((QString *)tpName);
      QMetaType::QMetaType(&local_398,iVar3);
      QSqlField::QSqlField(local_90,(QString *)local_390,local_398,in_RCX);
      QString::~QString((QString *)0x1140e0);
      QVariant::~QVariant(&local_b0);
      in_stack_fffffffffffffbf5 = false;
      if ((bVar2 & 1) != 0) {
        Qt::Literals::StringLiterals::operator____L1
                  ((char *)in_RDX,CONCAT17(bVar7,CONCAT16(uVar8,(uint6)in_stack_fffffffffffffbf0)));
        in_stack_fffffffffffffbf5 =
             operator==(in_RDX,(QLatin1StringView *)
                               CONCAT17(bVar7,CONCAT16(uVar8,CONCAT15(in_stack_fffffffffffffbf5,
                                                                      in_stack_fffffffffffffbf0))));
      }
      if ((bool)in_stack_fffffffffffffbf5 != false) {
        QSqlField::setAutoValue(SUB81(local_90,0));
      }
      QSqlQuery::value((int)&local_d0);
      QVariant::toInt((bool *)&local_d0);
      QSqlField::setRequired
                ((QSqlField *)
                 CONCAT17(bVar7,CONCAT16(uVar8,CONCAT15(in_stack_fffffffffffffbf5,
                                                        in_stack_fffffffffffffbf0))),
                 SUB41(in_stack_fffffffffffffbec >> 0x18,0));
      QVariant::~QVariant(&local_d0);
      QVariant::QVariant(&local_f0,(QString *)&local_358);
      QSqlField::setDefaultValue((QVariant *)local_90);
      QVariant::~QVariant(&local_f0);
      QSqlIndex::append((QSqlField *)in_RDI);
      QSqlField::~QSqlField(local_90);
      QString::~QString((QString *)0x1141f8);
      QString::~QString((QString *)0x114205);
    }
  }
  QString::~QString((QString *)0x11422d);
  QString::~QString((QString *)0x11423a);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return tpName;
  }
  __stack_chk_fail();
}

Assistant:

QSqlIndex QSQLiteDriverPrivate::getTableInfo(QSqlQuery &query, const QString &tableName,
                                             bool onlyPIndex) const
{
    Q_Q(const QSQLiteDriver);
    QString schema;
    QString table = q->escapeIdentifier(tableName, QSqlDriver::TableName);
    const auto indexOfSeparator = table.indexOf(u'.');
    if (indexOfSeparator > -1) {
        auto leftName = QStringView{table}.first(indexOfSeparator);
        auto rightName = QStringView{table}.sliced(indexOfSeparator + 1);
        if (isIdentifierEscaped(leftName) && isIdentifierEscaped(rightName)) {
            schema = leftName.toString() + u'.';
            table = rightName.toString();
        }
    }

    query.exec("PRAGMA "_L1 + schema + "table_info ("_L1 + table + u')');
    QSqlIndex ind;
    while (query.next()) {
        bool isPk = query.value(5).toInt();
        if (onlyPIndex && !isPk)
            continue;
        QString typeName = query.value(2).toString().toLower();
        QString defVal = query.value(4).toString();
        if (!defVal.isEmpty() && defVal.at(0) == u'\'') {
            const int end = defVal.lastIndexOf(u'\'');
            if (end > 0)
                defVal = defVal.mid(1, end - 1);
        }

        QSqlField fld(query.value(1).toString(), QMetaType(qGetColumnType(typeName)), tableName);
        if (isPk && (typeName == "integer"_L1))
            // INTEGER PRIMARY KEY fields are auto-generated in sqlite
            // INT PRIMARY KEY is not the same as INTEGER PRIMARY KEY!
            fld.setAutoValue(true);
        fld.setRequired(query.value(3).toInt() != 0);
        fld.setDefaultValue(defVal);
        ind.append(fld);
    }
    return ind;
}